

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall
SVGChart::LogTickIterator::AdjustRange(LogTickIterator *this,float *ioMin,float *ioMax)

{
  AxisSetup *pAVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  pAVar1 = (this->super_TickIterator).mAxisSetup;
  fVar4 = pAVar1->mLogBase;
  lVar2 = pAVar1->mMaxDecades;
  if (lVar2 < 1) {
    fVar7 = *ioMin;
  }
  else {
    fVar6 = (float)lVar2;
    fVar7 = *ioMax;
    fVar3 = 1e+10;
    if (fVar6 <= 1e+10) {
      fVar3 = fVar6;
    }
    fVar3 = powf(fVar4,fVar3);
    fVar7 = fVar7 / fVar3;
    *ioMin = fVar7;
  }
  fVar3 = *ioMax;
  if ((((fVar7 == 0.0) && (!NAN(fVar7))) && (fVar3 == 0.0)) && (!NAN(fVar3))) {
    *ioMin = 1e-10;
    *ioMax = 1.0;
    fVar7 = *ioMin;
    fVar3 = 1.0;
  }
  bVar5 = 0.0 < fVar7 && 0.0 < fVar3;
  if (bVar5) {
    fVar7 = RoundDown(this,fVar7 * 1.0001);
    *ioMin = fVar7;
    fVar7 = RoundUp(this,*ioMax * 0.9999);
    *ioMax = fVar7;
    if (*ioMin <= 1e-10 && *ioMin != 1e-10) {
      *ioMin = 1e-10;
    }
    lVar2 = ((this->super_TickIterator).mAxisSetup)->mMaxDecades;
    if (0 < lVar2) {
      fVar6 = (float)lVar2;
      fVar7 = *ioMax;
      fVar3 = 1e+10;
      if (fVar6 <= 1e+10) {
        fVar3 = fVar6;
      }
      fVar4 = powf(fVar4,fVar3);
      *ioMin = fVar7 / fVar4;
    }
  }
  return bVar5;
}

Assistant:

bool LogTickIterator::AdjustRange (float &ioMin, float &ioMax) const {

      float theBase = mAxisSetup->mLogBase;
      long theLogFac = 1;//mAxisSetup->mLogFactor;
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      if (ioMin == 0 && ioMax == 0) {
          ioMin = kLogMinClipValue;
          ioMax = 1.0f;
      }
      if (ioMin <= 0 || ioMax<=0) {
        return false;
      }
      ioMin = RoundDown (ioMin*kLittleIncrease);
      ioMax = RoundUp (ioMax*kLittleDecrease);

      if (ioMin<kLogMinClipValue) {
        ioMin = kLogMinClipValue;
      }
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      return true;
    }